

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O1

void __thiscall
gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this,long w,long h,long d)

{
  unsigned_short *puVar1;
  unsigned_short **ppuVar2;
  unsigned_short ***pppuVar3;
  ulong uVar4;
  runtime_error *this_00;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  if (((this->width != w) || (this->height != h)) || (this->depth != d)) {
    if (this->n < 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Cannot change size, because image is used as a wrapper");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (this->pixel != (unsigned_short *)0x0) {
      operator_delete__(this->pixel);
    }
    if (this->row != (unsigned_short **)0x0) {
      operator_delete__(this->row);
    }
    if (this->img != (unsigned_short ***)0x0) {
      operator_delete__(this->img);
    }
    uVar5 = (uint)d;
    this->depth = uVar5;
    this->width = w;
    this->height = h;
    lVar6 = (long)(int)uVar5 * h * w;
    this->n = lVar6;
    this->pixel = (unsigned_short *)0x0;
    this->row = (unsigned_short **)0x0;
    this->img = (unsigned_short ***)0x0;
    if (0 < lVar6) {
      uVar7 = (int)uVar5 * h;
      puVar1 = (unsigned_short *)operator_new__(lVar6 * 2);
      this->pixel = puVar1;
      ppuVar2 = (unsigned_short **)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
      this->row = ppuVar2;
      uVar4 = 0xffffffffffffffff;
      if (-1 < (int)uVar5) {
        uVar4 = (long)(int)uVar5 << 3;
      }
      pppuVar3 = (unsigned_short ***)operator_new__(uVar4);
      this->img = pppuVar3;
      *ppuVar2 = puVar1;
      if (1 < (long)uVar7) {
        lVar6 = 1;
        do {
          this->row[lVar6] = this->row[lVar6 + -1] + w;
          lVar6 = lVar6 + 1;
        } while (uVar7 - lVar6 != 0);
      }
      *this->img = this->row;
      if (1 < (int)uVar5) {
        uVar4 = 1;
        do {
          this->img[uVar4] = this->img[uVar4 - 1] + h;
          uVar4 = uVar4 + 1;
        } while ((uVar5 & 0x7fffffff) != uVar4);
      }
    }
  }
  return;
}

Assistant:

void setSize(long w, long h, long d)
    {
      if (width != w || height != h || depth != d)
      {
        if (n < 0)
        {
          throw std::runtime_error("Cannot change size, because image is used as a wrapper");
        }

        if (pixel != 0)
        {
          delete [] pixel;
        }

        if (row != 0)
        {
          delete [] row;
        }

        if (img != 0)
        {
          delete [] img;
        }

        depth=d;
        width=w;
        height=h;
        n=width*height*depth;

        pixel=0;
        row=0;
        img=0;

        if (n > 0)
        {
          long m=height*depth;

          pixel=new T[n];
          row=new T*[m];
          img=new T **[depth];

          row[0]=pixel;

          for (long k=1; k<m; k++)
          {
            row[k]=row[k-1]+width;
          }

          img[0]=row;

          for (int j=1; j<depth; j++)
          {
            img[j]=img[j-1]+height;
          }
        }
      }
    }